

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine_test.cpp
# Opt level: O2

void __thiscall
Engine_testObserveDoubleTagsVector_Test::TestBody(Engine_testObserveDoubleTagsVector_Test *this)

{
  vector<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
  *pvVar1;
  long lVar2;
  char *pcVar3;
  AssertHelper local_f8;
  AssertHelper local_f0;
  AssertionResult gtest_ar_1;
  _Head_base<0UL,_Handler_*,_false> local_c8;
  value_type im;
  vector<Tag,_std::allocator<Tag>_> tags;
  Engine e;
  
  std::make_unique<TestHandler>();
  local_c8._M_head_impl = (Handler *)im.time;
  im.time.__d.__r = (duration)0;
  Engine::Engine(&e,"test",(unique_ptr<Handler,_std::default_delete<Handler>_> *)&local_c8);
  if (local_c8._M_head_impl != (Handler *)0x0) {
    (*(local_c8._M_head_impl)->_vptr_Handler[3])();
  }
  local_c8._M_head_impl = (Handler *)0x0;
  if (im.time.__d.__r != 0) {
    (**(code **)(*(long *)im.time.__d.__r + 0x18))();
  }
  tags.super__Vector_base<Tag,_std::allocator<Tag>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  tags.super__Vector_base<Tag,_std::allocator<Tag>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  tags.super__Vector_base<Tag,_std::allocator<Tag>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<Tag,_std::allocator<Tag>_>::reserve(&tags,2);
  std::__cxx11::string::string((string *)&im,"Foo",(allocator *)&local_f8);
  std::__cxx11::string::string((string *)&gtest_ar_1,"Bar",(allocator *)&local_f0);
  std::vector<Tag,std::allocator<Tag>>::
  emplace_back<std::__cxx11::string_const&,std::__cxx11::string_const&>
            ((vector<Tag,std::allocator<Tag>> *)&tags,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&im,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar_1);
  std::__cxx11::string::~string((string *)&gtest_ar_1);
  std::__cxx11::string::~string((string *)&im);
  std::__cxx11::string::string((string *)&im,"Hello",(allocator *)&local_f8);
  std::__cxx11::string::string((string *)&gtest_ar_1,"World",(allocator *)&local_f0);
  std::vector<Tag,std::allocator<Tag>>::
  emplace_back<std::__cxx11::string_const&,std::__cxx11::string_const&>
            ((vector<Tag,std::allocator<Tag>> *)&tags,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&im,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar_1);
  std::__cxx11::string::~string((string *)&gtest_ar_1);
  std::__cxx11::string::~string((string *)&im);
  std::__cxx11::string::string((string *)&im,"histo.value",(allocator *)&local_f8);
  gtest_ar_1.success_ = true;
  gtest_ar_1._1_7_ = 0x405900083126e9;
  Engine::Observe<double,_nullptr>(&e,(string *)&im,(double *)&gtest_ar_1,&tags);
  std::__cxx11::string::~string((string *)&im);
  pvVar1 = Engine::GetHandlers(&e);
  lVar2 = __dynamic_cast((_Tuple_impl<0UL,_Handler_*,_std::default_delete<Handler>_>)
                         (((pvVar1->
                           super__Vector_base<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start)->_M_t).
                         super___uniq_ptr_impl<Handler,_std::default_delete<Handler>_>._M_t,
                         &Handler::typeinfo,&TestHandler::typeinfo,0);
  local_f8.data_._0_4_ = 1;
  gtest_ar_1._0_8_ = (*(long *)(lVar2 + 0x28) - *(long *)(lVar2 + 0x20)) / 0x58;
  testing::internal::CmpHelperEQ<int,unsigned_long>
            ((internal *)&im,"1","th->doubleMeasures.size()",(int *)&local_f8,
             (unsigned_long *)&gtest_ar_1);
  if ((char)im.time.__d.__r == '\0') {
    testing::Message::Message((Message *)&gtest_ar_1);
    if (im.name._M_dataplus._M_p == (pointer)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)im.name._M_dataplus._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_f8,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/rjenkins[P]stats-cpp/test/engine_test.cpp"
               ,0x18c,pcVar3);
    testing::internal::AssertHelper::operator=(&local_f8,(Message *)&gtest_ar_1);
    testing::internal::AssertHelper::~AssertHelper(&local_f8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_1);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&im.name);
    goto LAB_0011bc38;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&im.name);
  Measure<double>::Measure(&im,*(Measure<double> **)(lVar2 + 0x20));
  testing::internal::CmpHelperEQ<char[17],std::__cxx11::string>
            ((internal *)&gtest_ar_1,"\"test.histo.value\"","im.name",
             (char (*) [17])"test.histo.value",&im.name);
  if (gtest_ar_1.success_ == false) {
    testing::Message::Message((Message *)&local_f8);
    if (gtest_ar_1.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_f0,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/rjenkins[P]stats-cpp/test/engine_test.cpp"
               ,0x18e,pcVar3);
    testing::internal::AssertHelper::operator=(&local_f0,(Message *)&local_f8);
LAB_0011bc0f:
    testing::internal::AssertHelper::~AssertHelper(&local_f0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_f8);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_1.message_);
    local_f8.data_._0_4_ = 2;
    testing::internal::CmpHelperEQ<MetricTypes::MetricType,MetricTypes::MetricType>
              ((internal *)&gtest_ar_1,"MetricType::Histogram","im.type",(MetricType *)&local_f8,
               &im.type);
    if (gtest_ar_1.success_ == false) {
      testing::Message::Message((Message *)&local_f8);
      if (gtest_ar_1.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_f0,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/rjenkins[P]stats-cpp/test/engine_test.cpp"
                 ,399,pcVar3);
      testing::internal::AssertHelper::operator=(&local_f0,(Message *)&local_f8);
      goto LAB_0011bc0f;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_1.message_);
    local_f8.data_._0_4_ = 1;
    testing::internal::CmpHelperEQ<int,float>
              ((internal *)&gtest_ar_1,"1","im.rate",(int *)&local_f8,&im.rate);
    if (gtest_ar_1.success_ == false) {
      testing::Message::Message((Message *)&local_f8);
      if (gtest_ar_1.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_f0,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/rjenkins[P]stats-cpp/test/engine_test.cpp"
                 ,400,pcVar3);
      testing::internal::AssertHelper::operator=(&local_f0,(Message *)&local_f8);
      goto LAB_0011bc0f;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_1.message_);
    local_f8.data_ = (AssertHelperData *)0x405900083126e979;
    testing::internal::CmpHelperEQ<double,double>
              ((internal *)&gtest_ar_1,"100.0005","im.value",(double *)&local_f8,&im.value);
    if (gtest_ar_1.success_ == false) {
      testing::Message::Message((Message *)&local_f8);
      if (gtest_ar_1.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_f0,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/rjenkins[P]stats-cpp/test/engine_test.cpp"
                 ,0x191,pcVar3);
      testing::internal::AssertHelper::operator=(&local_f0,(Message *)&local_f8);
      goto LAB_0011bc0f;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_1.message_);
    local_f0.data_._0_4_ = 2;
    local_f8.data_ =
         (AssertHelperData *)
         ((long)im.tags.super__Vector_base<Tag,_std::allocator<Tag>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)im.tags.super__Vector_base<Tag,_std::allocator<Tag>_>._M_impl.
                super__Vector_impl_data._M_start >> 6);
    testing::internal::CmpHelperEQ<int,unsigned_long>
              ((internal *)&gtest_ar_1,"2","im.tags.size()",(int *)&local_f0,
               (unsigned_long *)&local_f8);
    if (gtest_ar_1.success_ == false) {
      testing::Message::Message((Message *)&local_f8);
      if (gtest_ar_1.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_f0,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/rjenkins[P]stats-cpp/test/engine_test.cpp"
                 ,0x192,pcVar3);
      testing::internal::AssertHelper::operator=(&local_f0,(Message *)&local_f8);
      goto LAB_0011bc0f;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_1.message_);
    testing::internal::CmpHelperEQ<char[4],std::__cxx11::string>
              ((internal *)&gtest_ar_1,"\"Foo\"","im.tags[0].name",(char (*) [4])"Foo",
               &(im.tags.super__Vector_base<Tag,_std::allocator<Tag>_>._M_impl.
                 super__Vector_impl_data._M_start)->name);
    if (gtest_ar_1.success_ == false) {
      testing::Message::Message((Message *)&local_f8);
      if (gtest_ar_1.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_f0,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/rjenkins[P]stats-cpp/test/engine_test.cpp"
                 ,0x193,pcVar3);
      testing::internal::AssertHelper::operator=(&local_f0,(Message *)&local_f8);
      goto LAB_0011bc0f;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_1.message_);
    testing::internal::CmpHelperEQ<char[4],std::__cxx11::string>
              ((internal *)&gtest_ar_1,"\"Bar\"","im.tags[0].value",(char (*) [4])"Bar",
               &(im.tags.super__Vector_base<Tag,_std::allocator<Tag>_>._M_impl.
                 super__Vector_impl_data._M_start)->value);
    if (gtest_ar_1.success_ == false) {
      testing::Message::Message((Message *)&local_f8);
      if (gtest_ar_1.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_f0,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/rjenkins[P]stats-cpp/test/engine_test.cpp"
                 ,0x194,pcVar3);
      testing::internal::AssertHelper::operator=(&local_f0,(Message *)&local_f8);
      goto LAB_0011bc0f;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_1.message_);
    testing::internal::CmpHelperEQ<char[6],std::__cxx11::string>
              ((internal *)&gtest_ar_1,"\"Hello\"","im.tags[1].name",(char (*) [6])"Hello",
               &im.tags.super__Vector_base<Tag,_std::allocator<Tag>_>._M_impl.
                super__Vector_impl_data._M_start[1].name);
    if (gtest_ar_1.success_ == false) {
      testing::Message::Message((Message *)&local_f8);
      if (gtest_ar_1.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_f0,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/rjenkins[P]stats-cpp/test/engine_test.cpp"
                 ,0x195,pcVar3);
      testing::internal::AssertHelper::operator=(&local_f0,(Message *)&local_f8);
      goto LAB_0011bc0f;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_1.message_);
    testing::internal::CmpHelperEQ<char[6],std::__cxx11::string>
              ((internal *)&gtest_ar_1,"\"World\"","im.tags[1].value",(char (*) [6])"World",
               &im.tags.super__Vector_base<Tag,_std::allocator<Tag>_>._M_impl.
                super__Vector_impl_data._M_start[1].value);
    if (gtest_ar_1.success_ == false) {
      testing::Message::Message((Message *)&local_f8);
      if (gtest_ar_1.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_f0,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/rjenkins[P]stats-cpp/test/engine_test.cpp"
                 ,0x196,pcVar3);
      testing::internal::AssertHelper::operator=(&local_f0,(Message *)&local_f8);
      testing::internal::AssertHelper::~AssertHelper(&local_f0);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_f8);
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_1.message_);
  Measure<double>::~Measure(&im);
LAB_0011bc38:
  std::vector<Tag,_std::allocator<Tag>_>::~vector(&tags);
  Engine::~Engine(&e);
  return;
}

Assistant:

TEST(Engine, testObserveDoubleTagsVector) {
    Engine e("test", std::move(std::make_unique<TestHandler>()));
    std::vector<Tag> tags;
    tags.reserve(2);
    Tag::appendTag(tags, "Foo", "Bar");
    Tag::appendTag(tags, "Hello", "World");
    e.Observe("histo.value", 100.0005, tags);
    const auto &h = e.GetHandlers()[0];
    auto *th = dynamic_cast<TestHandler *>(h.get());
    ASSERT_EQ(1, th->doubleMeasures.size());
    auto im = th->doubleMeasures[0];
    ASSERT_EQ("test.histo.value", im.name);
    ASSERT_EQ(MetricType::Histogram, im.type);
    ASSERT_EQ(1, im.rate);
    ASSERT_EQ(100.0005, im.value);
    ASSERT_EQ(2, im.tags.size());
    ASSERT_EQ("Foo", im.tags[0].name);
    ASSERT_EQ("Bar", im.tags[0].value);
    ASSERT_EQ("Hello", im.tags[1].name);
    ASSERT_EQ("World", im.tags[1].value);
}